

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcRootLogLikelihoodsMulti
          (BeagleCPUImpl<float,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *scaleBufferIndices,int count,double *outSumLogLikelihood
          )

{
  float fVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  float *pfVar5;
  size_type __n;
  reference pvVar6;
  reference pvVar7;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  int in_R9D;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double *in_stack_00000008;
  int i_4;
  int i_3;
  float tmpSum;
  float tmpScaleFactor;
  int j;
  float *cumulativeScaleFactors;
  int cumulativeScalingFactorIndex;
  int i_2;
  float sum;
  int k_2;
  int i_1;
  int k_1;
  int l;
  int i;
  int k;
  int v;
  int u;
  float *wt;
  float *frequencies;
  float *rootPartials;
  int rootPartialIndex;
  int subsetIndex;
  int returnCode;
  vector<float,_std::allocator<float>_> maxScaleFactor;
  vector<int,_std::allocator<int>_> indexMaxScale;
  value_type in_stack_fffffffffffffee0;
  value_type in_stack_fffffffffffffee4;
  size_type in_stack_fffffffffffffee8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffef0;
  vector<float,_std::allocator<float>_> *this_00;
  int local_ec;
  int local_e8;
  value_type local_e0;
  int local_dc;
  int local_cc;
  int local_c8;
  float local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_84;
  int local_80;
  undefined1 local_79 [49];
  vector<int,_std::allocator<int>_> local_48;
  int local_2c;
  int *local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<int>::allocator((allocator<int> *)0x1a7507);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  std::allocator<int>::~allocator((allocator<int> *)0x1a752d);
  __n = (size_type)*(int *)(in_RDI + 0x14);
  this_00 = (vector<float,_std::allocator<float>_> *)local_79;
  std::allocator<float>::allocator((allocator<float> *)0x1a754d);
  std::vector<float,_std::allocator<float>_>::vector
            (this_00,__n,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  std::allocator<float>::~allocator((allocator<float> *)0x1a7573);
  local_80 = 0;
  for (local_84 = 0; local_84 < local_2c; local_84 = local_84 + 1) {
    iVar2 = *(int *)(local_10 + (long)local_84 * 4);
    lVar3 = *(long *)(*(long *)(in_RDI + 0xa8) + (long)iVar2 * 8);
    lVar4 = *(long *)(*(long *)(in_RDI + 0xa0) + (long)*(int *)(local_20 + (long)local_84 * 4) * 8);
    pfVar5 = *(float **)
              (*(long *)(in_RDI + 0x98) + (long)*(int *)(local_18 + (long)local_84 * 4) * 8);
    local_a4 = 0;
    local_a8 = 0;
    for (local_ac = 0; local_ac < *(int *)(in_RDI + 0x14); local_ac = local_ac + 1) {
      for (local_b0 = 0; local_b0 < *(int *)(in_RDI + 0x24); local_b0 = local_b0 + 1) {
        *(float *)(*(long *)(in_RDI + 0xd8) + (long)local_a4 * 4) =
             *(float *)(lVar3 + (long)local_a8 * 4) * *pfVar5;
        local_a4 = local_a4 + 1;
        local_a8 = local_a8 + 1;
      }
    }
    for (local_b4 = 1; local_b4 < *(int *)(in_RDI + 0x34); local_b4 = local_b4 + 1) {
      local_a4 = 0;
      for (local_b8 = 0; local_b8 < *(int *)(in_RDI + 0x14); local_b8 = local_b8 + 1) {
        for (local_bc = 0; local_bc < *(int *)(in_RDI + 0x24); local_bc = local_bc + 1) {
          auVar9 = vfmadd213ss_fma(ZEXT416((uint)pfVar5[local_b4]),
                                   ZEXT416(*(uint *)(lVar3 + (long)local_a8 * 4)),
                                   ZEXT416(*(uint *)(*(long *)(in_RDI + 0xd8) + (long)local_a4 * 4))
                                  );
          *(int *)(*(long *)(in_RDI + 0xd8) + (long)local_a4 * 4) = auVar9._0_4_;
          local_a4 = local_a4 + 1;
          local_a8 = local_a8 + 1;
        }
      }
    }
    local_a4 = 0;
    for (local_c0 = 0; local_c0 < *(int *)(in_RDI + 0x14); local_c0 = local_c0 + 1) {
      local_c4 = 0.0;
      for (local_c8 = 0; local_c8 < *(int *)(in_RDI + 0x24); local_c8 = local_c8 + 1) {
        auVar9 = vfmadd213ss_fma(ZEXT416(*(uint *)(*(long *)(in_RDI + 0xd8) + (long)local_a4 * 4)),
                                 ZEXT416(*(uint *)(lVar4 + (long)local_c8 * 4)),
                                 ZEXT416((uint)local_c4));
        local_c4 = auVar9._0_4_;
        local_a4 = local_a4 + 1;
      }
      if ((*local_28 != -1) || ((*(ulong *)(in_RDI + 0x58) & 0x100) != 0)) {
        if ((*(ulong *)(in_RDI + 0x58) & 0x100) == 0) {
          local_cc = local_28[local_84];
        }
        else {
          local_cc = iVar2 - *(int *)(in_RDI + 0x10);
        }
        lVar3 = *(long *)(*(long *)(in_RDI + 0xb8) + (long)local_cc * 8);
        if (local_84 == 0) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_c0);
          *pvVar6 = 0;
          in_stack_fffffffffffffee4 = *(value_type *)(lVar3 + (long)local_c0 * 4);
          pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)(local_79 + 1),(long)local_c0
                             );
          *pvVar7 = in_stack_fffffffffffffee4;
          for (local_dc = 1; local_dc < local_2c; local_dc = local_dc + 1) {
            if ((*(ulong *)(in_RDI + 0x58) & 0x100) == 0) {
              local_e0 = *(value_type *)
                          (*(long *)(*(long *)(in_RDI + 0xb8) + (long)local_28[local_dc] * 8) +
                          (long)local_c0 * 4);
            }
            else {
              local_e0 = *(value_type *)
                          (*(long *)(*(long *)(in_RDI + 0xb8) +
                                    (long)(*(int *)(local_10 + (long)local_dc * 4) -
                                          *(int *)(in_RDI + 0x10)) * 8) + (long)local_c0 * 4);
            }
            in_stack_fffffffffffffee0 = local_e0;
            pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                               ((vector<float,_std::allocator<float>_> *)(local_79 + 1),
                                (long)local_c0);
            if (*pvVar7 < in_stack_fffffffffffffee0) {
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_c0);
              *pvVar6 = local_dc;
              pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                                 ((vector<float,_std::allocator<float>_> *)(local_79 + 1),
                                  (long)local_c0);
              *pvVar7 = local_e0;
            }
          }
        }
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_c0);
        if (local_84 != *pvVar6) {
          fVar1 = *(float *)(lVar3 + (long)local_c0 * 4);
          pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)(local_79 + 1),(long)local_c0
                             );
          dVar8 = exp((double)(fVar1 - *pvVar7));
          local_c4 = (float)((double)local_c4 * dVar8);
        }
      }
      if (local_84 == 0) {
        *(float *)(*(long *)(in_RDI + 0x108) + (long)local_c0 * 4) = local_c4;
      }
      else if (local_84 == local_2c + -1) {
        dVar8 = log((double)(*(float *)(*(long *)(in_RDI + 0x108) + (long)local_c0 * 4) + local_c4))
        ;
        *(float *)(*(long *)(in_RDI + 0x108) + (long)local_c0 * 4) = (float)dVar8;
      }
      else {
        *(float *)(*(long *)(in_RDI + 0x108) + (long)local_c0 * 4) =
             local_c4 + *(float *)(*(long *)(in_RDI + 0x108) + (long)local_c0 * 4);
      }
    }
  }
  if ((*local_28 != -1) || ((*(ulong *)(in_RDI + 0x58) & 0x100) != 0)) {
    for (local_e8 = 0; local_e8 < *(int *)(in_RDI + 0x14); local_e8 = local_e8 + 1) {
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(local_79 + 1),(long)local_e8);
      *(float *)(*(long *)(in_RDI + 0x108) + (long)local_e8 * 4) =
           *pvVar7 + *(float *)(*(long *)(in_RDI + 0x108) + (long)local_e8 * 4);
    }
  }
  auVar10 = ZEXT1664((undefined1  [16])0x0);
  *in_stack_00000008 = 0.0;
  for (local_ec = 0; local_ec < *(int *)(in_RDI + 0x14); local_ec = local_ec + 1) {
    auVar11._0_8_ = (double)*(float *)(*(long *)(in_RDI + 0x108) + (long)local_ec * 4);
    auVar11._8_8_ = auVar10._8_8_;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x78) + (long)local_ec * 8);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = *in_stack_00000008;
    auVar9 = vfmadd213sd_fma(auVar9,auVar11,auVar12);
    auVar10 = ZEXT1664(auVar9);
    *in_stack_00000008 = auVar9._0_8_;
  }
  if ((*in_stack_00000008 != *in_stack_00000008) ||
     (NAN(*in_stack_00000008) || NAN(*in_stack_00000008))) {
    local_80 = -8;
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  return local_80;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsMulti(const int* bufferIndices,
                                                         const int* categoryWeightsIndices,
                                                         const int* stateFrequenciesIndices,
                                                         const int* scaleBufferIndices,
                                                         int count,
                                                         double* outSumLogLikelihood) {
    // Here we do the 3 similar operations:
    //              1. to set the lnL to the contribution of the first subset,
    //              2. to add the lnL for other subsets up to the penultimate
    //              3. to add the final subset and take the lnL
    //      This form of the calc would not work when count == 1 because
    //              we need operation 1 and 3 in the preceding list.  This is not
    //              a problem, though as we deal with count == 1 in the previous
    //              branch.

    std::vector<int> indexMaxScale(kPatternCount);
    std::vector<REALTYPE> maxScaleFactor(kPatternCount);

    int returnCode = BEAGLE_SUCCESS;

    for (int subsetIndex = 0 ; subsetIndex < count; ++subsetIndex ) {
        const int rootPartialIndex = bufferIndices[subsetIndex];
        const REALTYPE* rootPartials = gPartials[rootPartialIndex];
        const REALTYPE* frequencies = gStateFrequencies[stateFrequenciesIndices[subsetIndex]];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[subsetIndex]];
        int u = 0;
        int v = 0;
        for (int k = 0; k < kPatternCount; k++) {
            for (int i = 0; i < kStateCount; i++) {
                integrationTmp[u] = rootPartials[v] * (REALTYPE) wt[0];
                u++;
                v++;
            }
            v += P_PAD;
        }
        for (int l = 1; l < kCategoryCount; l++) {
            u = 0;
            for (int k = 0; k < kPatternCount; k++) {
                for (int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += rootPartials[v] * (REALTYPE) wt[l];
                    u++;
                    v++;
                }
                v += P_PAD;
            }
        }
        u = 0;
        for (int k = 0; k < kPatternCount; k++) {
            REALTYPE sum = 0.0;
            for (int i = 0; i < kStateCount; i++) {
                sum += ((REALTYPE)frequencies[i]) * integrationTmp[u];
                u++;
            }

            // TODO: allow only some subsets to have scale indices
            if (scaleBufferIndices[0] != BEAGLE_OP_NONE || (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)) {
                int cumulativeScalingFactorIndex;
                if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)
                    cumulativeScalingFactorIndex = rootPartialIndex - kTipCount;
                else
                    cumulativeScalingFactorIndex = scaleBufferIndices[subsetIndex];

                const REALTYPE* cumulativeScaleFactors = gScaleBuffers[cumulativeScalingFactorIndex];

                if (subsetIndex == 0) {
                    indexMaxScale[k] = 0;
                    maxScaleFactor[k] = cumulativeScaleFactors[k];
                    for (int j = 1; j < count; j++) {
                        REALTYPE tmpScaleFactor;
                        if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)
                            tmpScaleFactor = gScaleBuffers[bufferIndices[j] - kTipCount][k];
                        else
                            tmpScaleFactor = gScaleBuffers[scaleBufferIndices[j]][k];

                        if (tmpScaleFactor > maxScaleFactor[k]) {
                            indexMaxScale[k] = j;
                            maxScaleFactor[k] = tmpScaleFactor;
                        }
                    }
                }

                if (subsetIndex != indexMaxScale[k])
                    sum *= exp((REALTYPE)(cumulativeScaleFactors[k] - maxScaleFactor[k]));
            }

            if (subsetIndex == 0) {
                outLogLikelihoodsTmp[k] = sum;
            } else if (subsetIndex == count - 1) {
                REALTYPE tmpSum = outLogLikelihoodsTmp[k] + sum;

                outLogLikelihoodsTmp[k] = log(tmpSum);
            } else {
                outLogLikelihoodsTmp[k] += sum;
            }
        }
    }

    if (scaleBufferIndices[0] != BEAGLE_OP_NONE || (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)) {
        for(int i=0; i<kPatternCount; i++)
            outLogLikelihoodsTmp[i] += maxScaleFactor[i];
    }

    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;

}